

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationDriveline::ChLinkMotorRotationDriveline
          (ChLinkMotorRotationDriveline *this)

{
  __shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  ChLinkMotorRotation::ChLinkMotorRotation(&this->super_ChLinkMotorRotation);
  *(undefined ***)
   &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
    super_ChLink.super_ChLinkBase.super_ChPhysicsItem = &PTR__ChLinkMotorRotationDriveline_0116a988;
  (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_rz = false;
  *(undefined8 *)&(this->super_ChLinkMotorRotation).field_0x278 = 0;
  *(undefined8 *)&this->field_0x280 = 0;
  (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint1).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->innerconstraint1).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->innerconstraint2).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->innerconstraint2).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ChLinkMateGeneric::SetupLinkMask((ChLinkMateGeneric *)this);
  std::make_shared<chrono::ChShaft>();
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_ChLinkMotorRotation).field_0x278,
             (__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChShaft>();
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChShaftsBody>();
  std::__shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->innerconstraint1).
              super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::make_shared<chrono::ChShaftsBody>();
  std::__shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->innerconstraint2).
              super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

ChLinkMotorRotationDriveline::ChLinkMotorRotationDriveline() {
    this->c_rz = false;
    SetupLinkMask();

    innershaft1 = chrono_types::make_shared<ChShaft>();
    innershaft2 = chrono_types::make_shared<ChShaft>();
    innerconstraint1 = chrono_types::make_shared<ChShaftsBody>();
    innerconstraint2 = chrono_types::make_shared<ChShaftsBody>();
}